

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O1

UriType * __thiscall
rapidjson::
GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::CreateSchema(GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
               *this,SchemaType **schema,PointerType *pointer,ValueType *v,ValueType *document,
              UriType *id)

{
  bool bVar1;
  Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
  *this_00;
  SchemaType *schema_00;
  GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  *rhs;
  Stack<rapidjson::CrtAllocator> local_68;
  
  if (pointer->parseErrorCode_ != kPointerParseErrorNone) {
    __assert_fail("pointer.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/schema.h"
                  ,0x881,
                  "const UriType &rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<>>>::CreateSchema(const SchemaType **, const PointerType &, const ValueType &, const ValueType &, const UriType &) [ValueT = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
                 );
  }
  local_68.stack_ = (char *)0x0;
  local_68.stackTop_ = (char *)0x0;
  local_68.allocator_ = (CrtAllocator *)0x0;
  local_68.ownAllocator_ = (CrtAllocator *)0x0;
  local_68.stackEnd_ = (char *)0x0;
  local_68.initialCapacity_ = 0x100;
  GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
  ::Stringify<true,rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>>
            ((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
              *)pointer,
             (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_68);
  if ((v->data_).f.flags == 3) {
    rhs = (GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
           *)(this->schemaMap_).stack_;
    if (rhs == (GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                *)(this->schemaMap_).stackTop_) {
      schema_00 = (SchemaType *)0x0;
    }
    else {
      schema_00 = (SchemaType *)0x0;
      do {
        bVar1 = GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                ::operator==(pointer,rhs);
        if (bVar1) {
          schema_00 = (SchemaType *)rhs[1].allocator_;
          break;
        }
        rhs = (GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
               *)&rhs[1].nameBuffer_;
      } while (rhs != (GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                       *)(this->schemaMap_).stackTop_);
    }
    if (schema_00 == (SchemaType *)0x0) {
      bVar1 = HandleRefSchema(this,pointer,schema,v,document,id);
      if (bVar1) goto LAB_00120746;
      this_00 = (Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
                 *)malloc(0x1a8);
      internal::
      Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
      ::Schema(this_00,this,pointer,v,document,this->allocator_,id);
      if (schema != (SchemaType **)0x0) {
        *schema = this_00;
      }
      document = (ValueType *)&this_00->id_;
      bVar1 = false;
    }
    else {
      if (schema != (SchemaType **)0x0) {
        *schema = schema_00;
      }
      AddSchemaRefs(this,schema_00);
      document = (ValueType *)schema_00;
LAB_00120746:
      bVar1 = true;
    }
    if (!bVar1) goto LAB_0012074f;
  }
  else {
    if (schema != (SchemaType **)0x0) {
      *schema = this->typeless_;
    }
    AddSchemaRefs(this,this->typeless_);
  }
  document = (ValueType *)id;
LAB_0012074f:
  internal::Stack<rapidjson::CrtAllocator>::Destroy(&local_68);
  return (UriType *)(SchemaType *)document;
}

Assistant:

bool Null() { return WriteType(kNullType); }